

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basics.cpp
# Opt level: O2

void observer(uint w)

{
  char *pcVar1;
  code *pcVar2;
  double dVar3;
  FlowBuilder this;
  char extraout_AL;
  char extraout_AL_00;
  uint uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  int local_31c;
  shared_ptr<tf::ChromeObserver> observer;
  Result local_308;
  vector<tf::Task,_std::allocator<tf::Task>_> tasks;
  ResultBuilder DOCTEST_RB;
  shared_ptr<tf::WorkerInterface> local_258;
  pointer local_240;
  undefined4 local_238;
  Taskflow taskflowA;
  Executor executor;
  
  local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)w,&local_258);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Executor::make_observer<tf::ChromeObserver>((Executor *)&observer);
  tf::Taskflow::Taskflow(&taskflowA);
  tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar6 = 0x40;
  while (this._graph = taskflowA.super_FlowBuilder._graph, bVar11 = iVar6 != 0, iVar6 = iVar6 + -1,
        bVar11) {
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
    ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
    *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
         &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
    *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
    *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
    pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
    (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
    *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
    *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
    *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
         &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_no_breaks = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_no_output = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_may_fail = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_should_fail = false;
    *(undefined3 *)&DOCTEST_RB.super_AssertData.m_test_case[1].field_0x3d = 0;
    *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
         (char *)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp:999:42)>
                 ::_M_invoke;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
         (double)std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp:999:42)>
                 ::_M_manager;
    *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 1;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)this._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
    local_308._0_8_ =
         ((this._graph)->
         super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         ).
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::vector<tf::Task,_std::allocator<tf::Task>_>::emplace_back<tf::Task>
              (&tasks,(Task *)&local_308);
  }
  lVar5 = 0x3f;
  lVar9 = 8;
  lVar10 = 0;
  while (lVar10 != 0x40) {
    lVar7 = lVar5;
    lVar8 = lVar9;
    while (bVar11 = lVar7 != 0, lVar7 = lVar7 + -1, bVar11) {
      uVar4 = rand();
      if ((uVar4 & 1) == 0) {
        tf::Task::precede<tf::Task&>
                  (tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar10,
                   (Task *)((long)&(tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->_node + lVar8));
      }
      lVar8 = lVar8 + 8;
    }
    lVar5 = lVar5 + -1;
    lVar9 = lVar9 + 8;
    lVar10 = lVar10 + 1;
  }
  tf::Executor::run_n((Future<void> *)&DOCTEST_RB,&executor,&taskflowA,0x10);
  std::future<void>::get((future<void> *)&DOCTEST_RB);
  tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB);
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData._71_2_ = 0x17;
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp"
  ;
  DOCTEST_RB.super_AssertData.m_line = 0x3f5;
  DOCTEST_RB.super_AssertData.m_expr = "observer->num_tasks() == 64*16";
  DOCTEST_RB.super_AssertData.m_failed = true;
  DOCTEST_RB.super_AssertData.m_threw = false;
  DOCTEST_RB.super_AssertData.m_threw_as = false;
  DOCTEST_RB.super_AssertData.m_exception_type = "";
  DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_240 = (pointer)tf::ChromeObserver::num_tasks
                                 (observer.
                                  super___shared_ptr<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
  local_238 = 0xc;
  local_31c = 0x400;
  doctest::detail::Expression_lhs<unsigned_long_const>::operator==
            (&local_308,(Expression_lhs<unsigned_long_const> *)&local_240,&local_31c);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_308);
  doctest::String::~String(&local_308.m_decomp);
  dVar3 = doctest::detail::ResultBuilder::log
                    (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (extraout_AL != '\0') {
    pcVar2 = (code *)swi(3);
    (*pcVar2)(SUB84(dVar3,0));
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  tf::ChromeObserver::clear
            (observer.super___shared_ptr<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
  DOCTEST_RB.super_AssertData._71_2_ = 0x17;
  DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
  DOCTEST_RB.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp"
  ;
  DOCTEST_RB.super_AssertData.m_line = 0x3f8;
  DOCTEST_RB.super_AssertData.m_expr = "observer->num_tasks() == 0";
  DOCTEST_RB.super_AssertData.m_failed = true;
  DOCTEST_RB.super_AssertData.m_threw = false;
  DOCTEST_RB.super_AssertData.m_threw_as = false;
  DOCTEST_RB.super_AssertData.m_exception_type = "";
  DOCTEST_RB.super_AssertData.m_exception_string = "";
  local_240 = (pointer)tf::ChromeObserver::num_tasks
                                 (observer.
                                  super___shared_ptr<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
  local_238 = 0xc;
  local_31c = 0;
  doctest::detail::Expression_lhs<unsigned_long_const>::operator==
            (&local_308,(Expression_lhs<unsigned_long_const> *)&local_240,&local_31c);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_308);
  doctest::String::~String(&local_308.m_decomp);
  dVar3 = doctest::detail::ResultBuilder::log
                    (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  if (extraout_AL_00 != '\0') {
    pcVar2 = (code *)swi(3);
    (*pcVar2)(SUB84(dVar3,0));
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  if (tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.super__Vector_impl_data.
    _M_finish = tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  std::_Vector_base<tf::Task,_std::allocator<tf::Task>_>::~_Vector_base
            (&tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>);
  tf::Taskflow::~Taskflow(&taskflowA);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&observer.super___shared_ptr<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Executor::~Executor(&executor);
  return;
}

Assistant:

void observer(unsigned w) {

  tf::Executor executor(w);

  auto observer = executor.make_observer<tf::ChromeObserver>();

  tf::Taskflow taskflowA;
  std::vector<tf::Task> tasks;
  // Static tasking
  for(auto i=0; i < 64; i ++) {
    tasks.emplace_back(taskflowA.emplace([](){}));
  }

  // Randomly specify dependency
  for(auto i=0; i < 64; i ++) {
    for(auto j=i+1; j < 64; j++) {
      if(rand()%2 == 0) {
        tasks[i].precede(tasks[j]);
      }
    }
  }

  executor.run_n(taskflowA, 16).get();

  REQUIRE(observer->num_tasks() == 64*16);

  observer->clear();
  REQUIRE(observer->num_tasks() == 0);
  tasks.clear();

}